

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O0

void basisu::compute_block_error
               (color_rgba (*block) [4],color_rgba (*decoded_block) [4],uint64_t *total_rgb_err,
               uint64_t *total_rgba_err,uint64_t *total_la_err)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int da;
  int db;
  int dg;
  int dr;
  uint32_t x;
  uint32_t y;
  uint64_t total_err_a;
  uint64_t total_err_b;
  uint64_t total_err_g;
  uint64_t total_err_r;
  uint64_t *total_la_err_local;
  uint64_t *total_rgba_err_local;
  uint64_t *total_rgb_err_local;
  color_rgba (*decoded_block_local) [4];
  color_rgba (*block_local) [4];
  
  total_err_r = 0;
  total_err_g = 0;
  total_err_b = 0;
  total_err_a = 0;
  for (y = 0; y < 4; y = y + 1) {
    for (x = 0; x < 4; x = x + 1) {
      iVar1 = (uint)block[y][x].field_0.m_comps[0] - (uint)decoded_block[y][x].field_0.m_comps[0];
      iVar2 = (uint)block[y][x].field_0.m_comps[1] - (uint)decoded_block[y][x].field_0.m_comps[1];
      iVar3 = (uint)block[y][x].field_0.m_comps[2] - (uint)decoded_block[y][x].field_0.m_comps[2];
      iVar4 = (uint)block[y][x].field_0.m_comps[3] - (uint)decoded_block[y][x].field_0.m_comps[3];
      total_err_r = (long)(iVar1 * iVar1) + total_err_r;
      total_err_g = (long)(iVar2 * iVar2) + total_err_g;
      total_err_b = (long)(iVar3 * iVar3) + total_err_b;
      total_err_a = (long)(iVar4 * iVar4) + total_err_a;
    }
  }
  *total_la_err = total_err_r + total_err_a;
  *total_rgb_err = total_err_r + total_err_g + total_err_b;
  *total_rgba_err = *total_rgb_err + total_err_a;
  return;
}

Assistant:

static void compute_block_error(const color_rgba block[4][4], const color_rgba decoded_block[4][4], uint64_t &total_rgb_err, uint64_t &total_rgba_err, uint64_t &total_la_err)
	{
		uint64_t total_err_r = 0, total_err_g = 0, total_err_b = 0, total_err_a = 0;

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				const int dr = (int)block[y][x].m_comps[0] - (int)decoded_block[y][x].m_comps[0];
				const int dg = (int)block[y][x].m_comps[1] - (int)decoded_block[y][x].m_comps[1];
				const int db = (int)block[y][x].m_comps[2] - (int)decoded_block[y][x].m_comps[2];
				const int da = (int)block[y][x].m_comps[3] - (int)decoded_block[y][x].m_comps[3];

				total_err_r += dr * dr;
				total_err_g += dg * dg;
				total_err_b += db * db;
				total_err_a += da * da;
			}
		}

		total_la_err = total_err_r + total_err_a;
		total_rgb_err = total_err_r + total_err_g + total_err_b;
		total_rgba_err = total_rgb_err + total_err_a;
	}